

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                  void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                  float scale_max,ImVec2 frame_size)

{
  ImGuiWindow *this;
  undefined1 auVar1 [12];
  ImU32 IVar2;
  undefined1 auVar3 [16];
  ImVec2 p_max;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiID id;
  ImU32 IVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 in_XMM0_Db;
  ImVec2 IVar13;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar14 [16];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined8 in_XMM2_Qb;
  float fVar15;
  undefined8 uVar17;
  undefined1 auVar16 [16];
  float fVar18;
  ImVec2 pos1;
  ImVec2 pos0;
  ImRect frame_bb;
  ImRect total_bb;
  uint local_150;
  ImVec2 local_128;
  ImU32 local_11c;
  ImGuiContext *local_118;
  ImVec2 local_110;
  undefined1 local_108 [16];
  ImVec2 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  ImRect local_b8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  ImGuiWindow *local_98;
  char *local_90;
  float local_88;
  float fStack_84;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  ImRect local_40;
  
  pIVar4 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_e8._4_4_ = in_XMM1_Db;
    local_e8._0_4_ = scale_max;
    local_e8._8_4_ = in_XMM1_Dc;
    local_e8._12_4_ = in_XMM1_Dd;
    local_108._8_8_ = in_XMM2_Qb;
    local_108._0_8_ = frame_size;
    local_c8 = scale_min;
    uStack_c4 = in_XMM0_Db;
    uStack_c0 = in_XMM0_Dc;
    uStack_bc = in_XMM0_Dd;
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    IVar13 = CalcTextSize(label,(char *)0x0,true,-1.0);
    uVar17 = local_108._8_8_;
    local_88 = IVar13.x;
    fStack_84 = IVar13.y;
    if ((local_108._0_4_ == 0.0) && (!NAN(local_108._0_4_))) {
      fVar10 = CalcItemWidth();
      auVar1._4_8_ = uVar17;
      auVar1._0_4_ = local_108._4_4_;
      auVar16._0_8_ = auVar1._0_8_ << 0x20;
      auVar16._8_4_ = local_108._8_4_;
      auVar16._12_4_ = local_108._12_4_;
      IVar13.y = fStack_84;
      IVar13.x = local_88;
      local_108._4_12_ = auVar16._4_12_;
      local_108._0_4_ = fVar10;
    }
    if ((local_108._4_4_ == 0.0) && (!NAN(local_108._4_4_))) {
      fVar10 = (pIVar4->Style).FramePadding.y;
      local_108._4_4_ = fVar10 + fVar10 + IVar13.y;
    }
    local_b8.Min = (this->DC).CursorPos;
    local_d8 = local_b8.Min.x;
    local_b8.Max.x = local_108._0_4_ + local_d8;
    fStack_d4 = local_b8.Min.y;
    local_b8.Max.y = local_108._4_4_ + fStack_d4;
    fStack_a0 = local_108._8_4_ + 0.0;
    fStack_9c = local_108._12_4_ + 0.0;
    fStack_d0 = 0.0;
    fStack_cc = 0.0;
    fVar10 = 0.0;
    if (0.0 < IVar13.x) {
      fVar10 = (pIVar4->Style).ItemInnerSpacing.x + IVar13.x;
    }
    local_f8 = (pIVar4->Style).FramePadding;
    uStack_f0 = 0;
    local_40.Max.y = local_b8.Max.y + 0.0;
    local_40.Max.x = fVar10 + local_b8.Max.x;
    local_118 = pIVar4;
    local_a8 = local_b8.Max.x;
    fStack_a4 = local_b8.Max.y;
    local_98 = this;
    local_40.Min = local_b8.Min;
    ItemSize(&local_40,(pIVar4->Style).FramePadding.y);
    bVar5 = ItemAdd(&local_40,0,&local_b8);
    if (bVar5) {
      bVar5 = ItemHoverable(&local_b8,id);
      local_90 = label;
      if (((local_c8 == 3.4028235e+38) && (!NAN(local_c8))) ||
         (((float)local_e8._0_4_ == 3.4028235e+38 && (!NAN((float)local_e8._0_4_))))) {
        if (values_count < 1) {
          fVar12 = -3.4028235e+38;
          fVar10 = 3.4028235e+38;
        }
        else {
          iVar8 = 0;
          fVar12 = -3.4028235e+38;
          fVar10 = 3.4028235e+38;
          do {
            fVar11 = (*values_getter)(data,iVar8);
            if (!NAN(fVar11)) {
              if (fVar11 <= fVar10) {
                fVar10 = fVar11;
              }
              fVar12 = (float)((uint)fVar12 & -(uint)(fVar11 <= fVar12) |
                              ~-(uint)(fVar11 <= fVar12) & (uint)fVar11);
            }
            iVar8 = iVar8 + 1;
          } while (values_count != iVar8);
        }
        uStack_c4 = 0;
        uStack_c0 = 0;
        uStack_bc = 0;
        local_c8 = (float)(~-(uint)(local_c8 == 3.4028235e+38) & (uint)local_c8 |
                          (uint)fVar10 & -(uint)(local_c8 == 3.4028235e+38));
        local_e8._0_4_ =
             ~-(uint)((float)local_e8._0_4_ == 3.4028235e+38) & local_e8._0_4_ |
             (uint)fVar12 & -(uint)((float)local_e8._0_4_ == 3.4028235e+38);
      }
      IVar13 = local_b8.Min;
      local_d8 = local_d8 + local_f8.x;
      fStack_d4 = fStack_d4 + local_f8.y;
      fStack_d0 = fStack_d0 + (float)uStack_f0;
      fStack_cc = fStack_cc + uStack_f0._4_4_;
      p_max.y = local_b8.Max.y;
      p_max.x = local_b8.Max.x;
      IVar6 = GetColorU32(7,1.0);
      RenderFrame(IVar13,p_max,IVar6,true,(local_118->Style).FrameRounding);
      if ((int)((plot_type == ImGuiPlotType_Lines) + 1) <= values_count) {
        local_a8 = local_a8 - local_f8.x;
        fStack_a4 = fStack_a4 - local_f8.y;
        fStack_a0 = fStack_a0 - (float)uStack_f0;
        fStack_9c = fStack_9c - uStack_f0._4_4_;
        iVar8 = (int)(float)local_108._0_4_;
        if (values_count <= (int)(float)local_108._0_4_) {
          iVar8 = values_count;
        }
        iVar7 = values_count - (uint)(plot_type == ImGuiPlotType_Lines);
        if (((!bVar5) || (fVar10 = (local_118->IO).MousePos.x, fVar10 < local_d8)) ||
           (fVar12 = (local_118->IO).MousePos.y, fVar12 < fStack_d4)) {
          local_150 = 0xffffffff;
        }
        else {
          local_150 = 0xffffffff;
          if ((fVar10 < local_a8) && (fVar12 < fStack_a4)) {
            fVar12 = (fVar10 - local_d8) / (local_a8 - local_d8);
            fVar10 = 0.9999;
            if (fVar12 <= 0.9999) {
              fVar10 = fVar12;
            }
            local_150 = (uint)((float)iVar7 * (float)(~-(uint)(fVar12 < 0.0) & (uint)fVar10));
            fVar10 = (*values_getter)(data,(int)(values_offset + local_150) % values_count);
            (*values_getter)(data,(int)(values_offset + local_150 + 1) % values_count);
            if (plot_type == ImGuiPlotType_Lines) {
              SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)local_150,(ulong)(local_150 + 1));
            }
            else if (plot_type == ImGuiPlotType_Histogram) {
              SetTooltip("%d: %8.4g",(double)fVar10,(ulong)local_150);
            }
          }
        }
        iVar8 = iVar8 - (uint)(plot_type == ImGuiPlotType_Lines);
        local_108 = ZEXT416(~-(uint)(local_c8 == (float)local_e8._0_4_) &
                            (uint)(1.0 / ((float)local_e8._0_4_ - local_c8)));
        fVar10 = (*values_getter)(data,values_offset % values_count);
        local_f8.x = fVar10;
        if (0.0 <= (float)local_e8._0_4_ * local_c8) {
          fVar10 = (float)(~-(uint)(local_c8 < 0.0) & 0x3f800000);
        }
        else {
          fVar10 = -local_c8 * (float)local_108._0_4_;
        }
        local_11c = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x28,1.0);
        IVar6 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x29,1.0);
        if (0 < iVar8) {
          fVar11 = (float)local_108._0_4_ * (local_f8.x - local_c8);
          fVar12 = 1.0;
          if (fVar11 <= 1.0) {
            fVar12 = fVar11;
          }
          local_e8 = ZEXT416((uint)(1.0 / (float)iVar8));
          local_f8.x = (float)iVar7;
          local_a8 = local_a8 - local_d8;
          fStack_a4 = fStack_a4 - fStack_d4;
          fStack_a0 = fStack_a0 - fStack_d0;
          fStack_9c = fStack_9c - fStack_cc;
          local_78 = fStack_d4;
          fStack_74 = fStack_d4;
          fStack_70 = fStack_d4;
          fStack_6c = fStack_d4;
          local_58 = fStack_a4 * fVar10 + fStack_d4;
          fVar10 = 0.0;
          fVar12 = (float)(-(uint)(fVar11 < 0.0) & 0x3f800000 |
                          ~-(uint)(fVar11 < 0.0) & (uint)(1.0 - fVar12));
          local_68 = fStack_a4;
          fStack_64 = fStack_a4;
          fStack_60 = fStack_a4;
          fStack_5c = fStack_a4;
          fStack_54 = fStack_a4;
          fStack_50 = fStack_a4;
          fStack_4c = fStack_a4;
          do {
            uVar9 = (uint)(fVar10 * local_f8.x + 0.5);
            fVar11 = (*values_getter)(data,(int)(values_offset + 1 + uVar9) % values_count);
            fVar15 = (float)local_e8._0_4_ + fVar10;
            fVar18 = (fVar11 - local_c8) * (float)local_108._0_4_;
            fVar11 = 1.0;
            if (fVar18 <= 1.0) {
              fVar11 = fVar18;
            }
            fVar11 = (float)(-(uint)(fVar18 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar18 < 0.0) & (uint)(1.0 - fVar11));
            fVar10 = fVar10 * local_a8 + local_d8;
            local_110.y = fVar12 * fStack_a4 + fStack_d4;
            local_110.x = fVar10;
            local_128.x = local_a8 * fVar15 + local_d8;
            if (plot_type == ImGuiPlotType_Lines) {
              local_128.y = local_68 * fVar11 + local_78;
              IVar2 = local_11c;
              if (local_150 == uVar9) {
                IVar2 = IVar6;
              }
              ImDrawList::AddLine(local_98->DrawList,&local_110,&local_128,IVar2,1.0);
            }
            else {
              local_128.y = local_58;
              if (plot_type == ImGuiPlotType_Histogram) {
                if (fVar10 + 2.0 <= local_128.x) {
                  local_128.x = local_128.x + -1.0;
                }
                IVar2 = local_11c;
                if (local_150 == uVar9) {
                  IVar2 = IVar6;
                }
                ImDrawList::AddRectFilled(local_98->DrawList,&local_110,&local_128,IVar2,0.0,0xf);
              }
            }
            iVar8 = iVar8 + -1;
            fVar10 = fVar15;
            fVar12 = fVar11;
          } while (iVar8 != 0);
        }
      }
      if (overlay_text != (char *)0x0) {
        local_110.y = local_b8.Min.y + (local_118->Style).FramePadding.y;
        local_110.x = local_b8.Min.x;
        local_128.x = 0.5;
        local_128.y = 0.0;
        RenderTextClipped(&local_110,&local_b8.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_128
                          ,(ImRect *)0x0);
      }
      if (0.0 < local_88) {
        auVar3._4_4_ = fStack_d4;
        auVar3._0_4_ = local_d8;
        auVar3._8_4_ = fStack_d0;
        auVar3._12_4_ = fStack_cc;
        auVar14._4_12_ = auVar3._4_12_;
        auVar14._0_4_ = local_b8.Max.x + (local_118->Style).ItemInnerSpacing.x;
        RenderText(auVar14._0_8_,local_90,(char *)0x0,true);
      }
    }
  }
  return;
}

Assistant:

void ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 frame_size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (frame_size.x == 0.0f)
        frame_size.x = CalcItemWidth();
    if (frame_size.y == 0.0f)
        frame_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return;
    const bool hovered = ItemHoverable(frame_bb, id);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            if (v != v) // Ignore NaN values
                continue;
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const int values_count_min = (plot_type == ImGuiPlotType_Lines) ? 2 : 1;
    if (values_count >= values_count_min)
    {
        int res_w = ImMin((int)frame_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        int v_hovered = -1;
        if (hovered && inner_bb.Contains(g.IO.MousePos))
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx+1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            v_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (-scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f,0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);
}